

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_swab.c
# Opt level: O0

void TIFFSwabArrayOfShort(uint16_t *wp,tmsize_t n)

{
  undefined1 uVar1;
  uchar t;
  uchar *cp;
  tmsize_t n_local;
  uint16_t *wp_local;
  
  cp = (uchar *)n;
  n_local = (tmsize_t)wp;
  while (0 < (long)cp) {
    uVar1 = *(undefined1 *)(n_local + 1);
    *(undefined1 *)(n_local + 1) = *(undefined1 *)n_local;
    *(undefined1 *)n_local = uVar1;
    n_local = n_local + 2;
    cp = cp + -1;
  }
  return;
}

Assistant:

void TIFFSwabArrayOfShort(register uint16_t *wp, tmsize_t n)
{
    register unsigned char *cp;
    register unsigned char t;
    assert(sizeof(uint16_t) == 2);
    /* XXX unroll loop some */
    while (n-- > 0)
    {
        cp = (unsigned char *)wp;
        t = cp[1];
        cp[1] = cp[0];
        cp[0] = t;
        wp++;
    }
}